

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool send_shutdown,_Bool *done)

{
  void *pvVar1;
  long lVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  char *local_488;
  _Bool local_461;
  ulong uStack_460;
  _Bool input_pending;
  size_t i;
  unsigned_long sslerr;
  int err;
  int nread;
  char buf [1024];
  CURLcode result;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  _Bool *done_local;
  _Bool send_shutdown_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  lVar2 = *(long *)((long)pvVar1 + 0x30);
  sslerr._4_4_ = 0xffffffff;
  if ((*(long *)(lVar2 + 8) == 0) || (((byte)cf->field_0x24 >> 1 & 1) != 0)) {
    *done = true;
    goto code_r0x001b0f33;
  }
  *(undefined4 *)((long)pvVar1 + 0x58) = 0;
  *done = false;
  uVar4 = SSL_get_shutdown(*(SSL **)(lVar2 + 8));
  if ((uVar4 & 1) == 0) {
    ERR_clear_error();
    for (uStack_460 = 0; uStack_460 < 10; uStack_460 = uStack_460 + 1) {
      sslerr._4_4_ = SSL_read(*(SSL **)(lVar2 + 8),&err,0x400);
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"SSL shutdown not sent, read -> %d",(ulong)sslerr._4_4_);
      }
      if ((int)sslerr._4_4_ < 1) break;
    }
    sslerr._0_4_ = SSL_get_error(*(SSL **)(lVar2 + 8),sslerr._4_4_);
    if ((sslerr._4_4_ == 0) && ((int)sslerr == 6)) {
      if (!send_shutdown) {
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"SSL shutdown received, not sending");
        }
        *done = true;
        goto code_r0x001b0f33;
      }
      _Var3 = (*cf->next->cft->is_alive)(cf->next,data,&local_461);
      if (!_Var3) {
        *(byte *)((long)pvVar1 + 0x5c) = *(byte *)((long)pvVar1 + 0x5c) & 0xfd | 2;
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"peer closed connection");
        }
        *done = true;
        goto code_r0x001b0f33;
      }
    }
  }
  if (send_shutdown) {
    ERR_clear_error();
    iVar5 = SSL_shutdown(*(SSL **)(lVar2 + 8));
    if (iVar5 == 1) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"SSL shutdown finished");
      }
      *done = true;
      goto code_r0x001b0f33;
    }
    iVar5 = SSL_get_error(*(SSL **)(lVar2 + 8),sslerr._4_4_);
    if (iVar5 == 3) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"SSL shutdown still wants to send");
      }
      *(undefined4 *)((long)pvVar1 + 0x58) = 2;
      goto code_r0x001b0f33;
    }
  }
  for (uStack_460 = 0; uStack_460 < 10; uStack_460 = uStack_460 + 1) {
    ERR_clear_error();
    sslerr._4_4_ = SSL_read(*(SSL **)(lVar2 + 8),&err,0x400);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"SSL shutdown read -> %d",(ulong)sslerr._4_4_);
    }
    if ((int)sslerr._4_4_ < 1) break;
  }
  sslerr._0_4_ = SSL_get_error(*(SSL **)(lVar2 + 8),sslerr._4_4_);
  switch((int)sslerr) {
  case 0:
  case 2:
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"SSL shutdown sent, want receive");
    }
    *(undefined4 *)((long)pvVar1 + 0x58) = 1;
    break;
  default:
    i = ERR_get_error();
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      if (i == 0) {
        local_488 = SSL_ERROR_to_str((int)sslerr);
      }
      else {
        local_488 = ossl_strerror(i,(char *)&err,0x400);
      }
      puVar6 = (uint *)__errno_location();
      Curl_trc_cf_infof(data,cf,"SSL shutdown, ignore recv error: \'%s\', errno %d",local_488,
                        (ulong)*puVar6);
    }
    *done = true;
    break;
  case 3:
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"SSL shutdown send blocked");
    }
    *(undefined4 *)((long)pvVar1 + 0x58) = 2;
    break;
  case 6:
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"SSL shutdown not received, but closed");
    }
    *done = true;
  }
code_r0x001b0f33:
  cf->field_0x24 = cf->field_0x24 & 0xfd | (*done & 1U) << 1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_shutdown(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool send_shutdown, bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  CURLcode result = CURLE_OK;
  char buf[1024];
  int nread = -1, err;
  unsigned long sslerr;
  size_t i;

  DEBUGASSERT(octx);
  if(!octx->ssl || cf->shutdown) {
    *done = TRUE;
    goto out;
  }

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  *done = FALSE;
  if(!(SSL_get_shutdown(octx->ssl) & SSL_SENT_SHUTDOWN)) {
    /* We have not started the shutdown from our side yet. Check
     * if the server already sent us one. */
    ERR_clear_error();
    for(i = 0; i < 10; ++i) {
      nread = SSL_read(octx->ssl, buf, (int)sizeof(buf));
      CURL_TRC_CF(data, cf, "SSL shutdown not sent, read -> %d", nread);
      if(nread <= 0)
        break;
    }
    err = SSL_get_error(octx->ssl, nread);
    if(!nread && err == SSL_ERROR_ZERO_RETURN) {
      bool input_pending;
      /* Yes, it did. */
      if(!send_shutdown) {
        CURL_TRC_CF(data, cf, "SSL shutdown received, not sending");
        *done = TRUE;
        goto out;
      }
      else if(!cf->next->cft->is_alive(cf->next, data, &input_pending)) {
        /* Server closed the connection after its closy notify. It
         * seems not interested to see our close notify, so do not
         * send it. We are done. */
        connssl->peer_closed = TRUE;
        CURL_TRC_CF(data, cf, "peer closed connection");
        *done = TRUE;
        goto out;
      }
    }
  }

  /* SSL should now have started the shutdown from our side. Since it
   * was not complete, we are lacking the close notify from the server. */
  if(send_shutdown) {
    ERR_clear_error();
    if(SSL_shutdown(octx->ssl) == 1) {
      CURL_TRC_CF(data, cf, "SSL shutdown finished");
      *done = TRUE;
      goto out;
    }
    if(SSL_ERROR_WANT_WRITE == SSL_get_error(octx->ssl, nread)) {
      CURL_TRC_CF(data, cf, "SSL shutdown still wants to send");
      connssl->io_need = CURL_SSL_IO_NEED_SEND;
      goto out;
    }
    /* Having sent the close notify, we use SSL_read() to get the
     * missing close notify from the server. */
  }

  for(i = 0; i < 10; ++i) {
    ERR_clear_error();
    nread = SSL_read(octx->ssl, buf, (int)sizeof(buf));
    CURL_TRC_CF(data, cf, "SSL shutdown read -> %d", nread);
    if(nread <= 0)
      break;
  }
  err = SSL_get_error(octx->ssl, nread);
  switch(err) {
  case SSL_ERROR_ZERO_RETURN: /* no more data */
    CURL_TRC_CF(data, cf, "SSL shutdown not received, but closed");
    *done = TRUE;
    break;
  case SSL_ERROR_NONE: /* just did not get anything */
  case SSL_ERROR_WANT_READ:
    /* SSL has send its notify and now wants to read the reply
     * from the server. We are not really interested in that. */
    CURL_TRC_CF(data, cf, "SSL shutdown sent, want receive");
    connssl->io_need = CURL_SSL_IO_NEED_RECV;
    break;
  case SSL_ERROR_WANT_WRITE:
    CURL_TRC_CF(data, cf, "SSL shutdown send blocked");
    connssl->io_need = CURL_SSL_IO_NEED_SEND;
    break;
  default:
    /* Server seems to have closed the connection without sending us
     * a close notify. */
    sslerr = ERR_get_error();
    CURL_TRC_CF(data, cf, "SSL shutdown, ignore recv error: '%s', errno %d",
                (sslerr ?
                 ossl_strerror(sslerr, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
    *done = TRUE;
    result = CURLE_OK;
    break;
  }

out:
  cf->shutdown = (result || *done);
  return result;
}